

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  bool bVar1;
  Uint32 UVar2;
  Char *pCVar3;
  pointer ppVar4;
  InstanceDesc *Desc_00;
  BottomLevelASVkImpl *pBVar5;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  bool bVar6;
  int local_104;
  bool local_fa;
  bool local_f9;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> local_d8;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> pPrevBLAS;
  Uint32 PrevIndex;
  InstanceDesc *Desc;
  string msg_1;
  HashMapStringKey local_98;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
  local_88;
  iterator Iter;
  TLASBuildInstanceData *Inst;
  Uint32 local_70;
  Uint32 i;
  Uint32 InstanceOffset;
  bool Changed;
  string msg;
  HIT_GROUP_BINDING_MODE BindingMode_local;
  Uint32 HitGroupStride_local;
  Uint32 BaseContributionToHitGroupIndex_local;
  Uint32 InstanceCount_local;
  TLASBuildInstanceData *pInstances_local;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xb] = BindingMode;
  msg.field_2._12_4_ = HitGroupStride;
  if ((this->m_BuildInfo).InstanceCount != InstanceCount) {
    FormatString<char[26],char[49]>
              ((string *)&InstanceOffset,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_BuildInfo.InstanceCount == InstanceCount",
               (char (*) [49])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateInstances",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xac);
    std::__cxx11::string::~string((string *)&InstanceOffset);
  }
  i._3_1_ = 0;
  Inst._4_4_ = 0;
  local_70 = BaseContributionToHitGroupIndex;
  while( true ) {
    if (InstanceCount <= Inst._4_4_) {
      if (msg.field_2._M_local_buf[0xb] == '\x02') {
        local_104 = msg.field_2._12_4_;
      }
      else {
        local_104 = 0;
      }
      UVar2 = (local_70 + local_104) - 1;
      bVar1 = true;
      if ((i._3_1_ & 1) == 0) {
        bVar1 = (this->m_BuildInfo).HitGroupStride != msg.field_2._12_4_;
      }
      bVar6 = true;
      if (!bVar1) {
        bVar6 = (this->m_BuildInfo).FirstContributionToHitGroupIndex !=
                BaseContributionToHitGroupIndex;
      }
      bVar1 = true;
      if (!bVar6) {
        bVar1 = (this->m_BuildInfo).LastContributionToHitGroupIndex != UVar2;
      }
      bVar6 = true;
      if (!bVar1) {
        bVar6 = (this->m_BuildInfo).BindingMode != msg.field_2._M_local_buf[0xb];
      }
      if (bVar6) {
        LOCK();
        (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
             (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      (this->m_BuildInfo).HitGroupStride = msg.field_2._12_4_;
      (this->m_BuildInfo).FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
      (this->m_BuildInfo).LastContributionToHitGroupIndex = UVar2;
      (this->m_BuildInfo).BindingMode = msg.field_2._M_local_buf[0xb];
      return true;
    }
    Iter.
    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
               )(pInstances + Inst._4_4_);
    HashMapStringKey::HashMapStringKey
              (&local_98,
               (Char *)(((__node_type *)
                        Iter.
                        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                        ._M_cur)->super__Hash_node_base)._M_nxt,false);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
         ::find(&this->m_Instances,&local_98);
    HashMapStringKey::~HashMapStringKey(&local_98);
    msg_1.field_2._8_8_ =
         std::
         unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
         ::end(&this->m_Instances);
    bVar1 = std::__detail::operator==
                      (&local_88,
                       (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                        *)((long)&msg_1.field_2 + 8));
    if (bVar1) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
                           *)&local_88);
    Desc_00 = &ppVar4->second;
    pPrevBLAS.m_pObject._4_4_ = Desc_00->ContributionToHitGroupIndex;
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr(&local_d8,&(ppVar4->second).pBLAS);
    pBVar5 = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                       (*(IBottomLevelAS **)
                         ((long)Iter.
                                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                                ._M_cur + 8));
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=(&(ppVar4->second).pBLAS,pBVar5);
    Desc_00->ContributionToHitGroupIndex =
         *(Uint32 *)
          ((long)Iter.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                 ._M_cur + 0x48);
    CalculateHitGroupIndex(Desc_00,&local_70,msg.field_2._12_4_,msg.field_2._M_local_buf[0xb]);
    local_f9 = true;
    if ((i._3_1_ & 1) == 0) {
      local_f9 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator!=
                           (&local_d8,&(ppVar4->second).pBLAS);
    }
    local_fa = true;
    if (local_f9 == false) {
      local_fa = pPrevBLAS.m_pObject._4_4_ != Desc_00->ContributionToHitGroupIndex;
    }
    i._3_1_ = local_fa;
    pBVar5 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->(&(ppVar4->second).pBLAS);
    UVar2 = BottomLevelASBase<Diligent::EngineVkImplTraits>::DvpGetVersion
                      (&pBVar5->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
    (ppVar4->second).dvpVersion = UVar2;
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::~RefCntAutoPtr(&local_d8);
    Inst._4_4_ = Inst._4_4_ + 1;
  }
  FormatString<char[36],char_const*,char[39]>
            ((string *)&Desc,(Diligent *)"Failed to find instance with name \'",
             (char (*) [36])
             Iter.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
             ._M_cur,(char **)"\' in instances from the previous build",
             (char (*) [39])CONCAT44(in_register_00000084,HitGroupStride));
  pCVar3 = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (pCVar3,"UpdateInstances",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
             ,0xb9);
  std::__cxx11::string::~string((string *)&Desc);
  return false;
}

Assistant:

bool UpdateInstances(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        VERIFY_EXPR(this->m_BuildInfo.InstanceCount == InstanceCount);
#ifdef DILIGENT_DEVELOPMENT
        bool Changed = false;
#endif
        Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

        for (Uint32 i = 0; i < InstanceCount; ++i)
        {
            const auto& Inst = pInstances[i];
            auto        Iter = this->m_Instances.find(Inst.InstanceName);

            if (Iter == this->m_Instances.end())
            {
                UNEXPECTED("Failed to find instance with name '", Inst.InstanceName, "' in instances from the previous build");
                return false;
            }

            auto&      Desc      = Iter->second;
            const auto PrevIndex = Desc.ContributionToHitGroupIndex;
            const auto pPrevBLAS = Desc.pBLAS;

            Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
            Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            //Desc.InstanceIndex             = i; // keep Desc.InstanceIndex unmodified
            CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
            Changed         = Changed || (pPrevBLAS != Desc.pBLAS);
            Changed         = Changed || (PrevIndex != Desc.ContributionToHitGroupIndex);
            Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
        }

        InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

#ifdef DILIGENT_DEVELOPMENT
        Changed = Changed || (this->m_BuildInfo.HitGroupStride != HitGroupStride);
        Changed = Changed || (this->m_BuildInfo.FirstContributionToHitGroupIndex != BaseContributionToHitGroupIndex);
        Changed = Changed || (this->m_BuildInfo.LastContributionToHitGroupIndex != InstanceOffset);
        Changed = Changed || (this->m_BuildInfo.BindingMode != BindingMode);
        if (Changed)
            this->m_DvpVersion.fetch_add(1);
#endif
        this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
        this->m_BuildInfo.BindingMode                      = BindingMode;

        return true;
    }